

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O2

void make_parser(void)

{
  action *paVar1;
  long lVar2;
  
  parser = (action **)allocate(nstates << 3);
  for (lVar2 = 0; lVar2 < nstates; lVar2 = lVar2 + 1) {
    paVar1 = parse_actions((int)lVar2);
    parser[lVar2] = paVar1;
  }
  find_final_state();
  remove_conflicts();
  unused_rules();
  if (RRtotal + SRtotal != 0 && SCARRY4(RRtotal,SRtotal) == RRtotal + SRtotal < 0) {
    total_conflicts();
  }
  defreds();
  return;
}

Assistant:

void make_parser()
{
    register int i;

    parser = NEW2(nstates, action *);
    for (i = 0; i < nstates; i++)
	parser[i] = parse_actions(i);

    find_final_state();
    remove_conflicts();
    unused_rules();
    if (SRtotal + RRtotal > 0) total_conflicts();
    defreds();
}